

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_lake_shrine_platforms_map.hpp
# Opt level: O0

void __thiscall
PatchOptimizeLakeShrinePlatformsMap::inject_code
          (PatchOptimizeLakeShrinePlatformsMap *this,ROM *rom,World *world)

{
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::DataRegister> __l_02;
  uint32_t uVar1;
  Map *this_00;
  allocator<char> local_379;
  string local_378;
  uint32_t local_358;
  allocator<md::AddressRegister> local_351;
  uint32_t update_func_addr;
  AddressRegister local_340;
  iterator local_330;
  size_type local_328;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_320;
  allocator<md::DataRegister> local_301;
  DataRegister local_300;
  iterator local_2f0;
  size_type local_2e8;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_2e0;
  allocator<char> local_2c1;
  string local_2c0;
  AddressRegister local_2a0;
  AddressInRegister local_290;
  AddressRegister local_270;
  AddressInRegister local_260;
  allocator<char> local_239;
  string local_238;
  AddressRegister local_218;
  AddressInRegister local_208;
  AddressRegister local_1e8;
  DataRegister local_1d8;
  AddressRegister local_1c8;
  allocator<char> local_1b1;
  string local_1b0;
  DataRegister local_190;
  allocator<char> local_179;
  string local_178;
  DataRegister local_158;
  Param local_148 [2];
  allocator<md::AddressRegister> local_131;
  AddressRegister local_130;
  AddressRegister local_120;
  iterator local_110;
  size_type local_108;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_100;
  allocator<md::DataRegister> local_e5 [13];
  DataRegister local_d8;
  iterator local_c8;
  size_type local_c0;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_b8;
  undefined1 local_a0 [8];
  Code func;
  uint32_t ADDR_BEHAVIOR_FALL;
  uint32_t ADDR_NO_BEHAVIOR;
  World *world_local;
  ROM *rom_local;
  PatchOptimizeLakeShrinePlatformsMap *this_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0x9b458;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0x9b652;
  md::Code::Code((Code *)local_a0);
  md::DataRegister::DataRegister(&local_d8,'\0');
  local_c8 = &local_d8;
  local_c0 = 1;
  std::allocator<md::DataRegister>::allocator(local_e5);
  __l_02._M_len = local_c0;
  __l_02._M_array = local_c8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_b8,__l_02,local_e5);
  md::AddressRegister::AddressRegister(&local_130,'\0');
  md::AddressRegister::AddressRegister(&local_120,'\x01');
  local_110 = &local_130;
  local_108 = 2;
  std::allocator<md::AddressRegister>::allocator(&local_131);
  __l_01._M_len = local_108;
  __l_01._M_array = local_110;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_100,__l_01,&local_131);
  md::Code::movem_to_stack((Code *)local_a0,&local_b8,&local_100);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_100);
  std::allocator<md::AddressRegister>::~allocator(&local_131);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_b8);
  std::allocator<md::DataRegister>::~allocator(local_e5);
  addr_<void>((uint32_t)local_148,0xff5430);
  md::DataRegister::DataRegister(&local_158,'\0');
  md::Code::movew((Code *)local_a0,local_148,(Param *)&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"player_not_on_entity",&local_179);
  md::Code::bmi((Code *)local_a0,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  md::DataRegister::DataRegister(&local_190,'\0');
  md::Code::cmpiw((Code *)local_a0,0x500,(Param *)&local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"player_not_on_entity",&local_1b1);
  md::Code::bgt((Code *)local_a0,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  md::AddressRegister::AddressRegister(&local_1c8,'\x01');
  md::Code::lea((Code *)local_a0,0xff5400,&local_1c8);
  md::DataRegister::DataRegister(&local_1d8,'\0');
  md::AddressRegister::AddressRegister(&local_1e8,'\x01');
  md::Code::adda((Code *)local_a0,(Param *)&local_1d8,&local_1e8);
  md::AddressRegister::AddressRegister(&local_218,'\x01');
  addr_<int>(&local_208,&local_218,0x32);
  md::Code::cmpil((Code *)local_a0,0x9b458,&local_208.super_Param);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"player_not_on_entity",&local_239);
  md::Code::bne((Code *)local_a0,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  md::AddressRegister::AddressRegister(&local_270,'\x01');
  addr_<int>(&local_260,&local_270,0x32);
  md::Code::movel((Code *)local_a0,0x9b652,&local_260.super_Param);
  md::AddressRegister::AddressRegister(&local_2a0,'\x01');
  addr_<int>(&local_290,&local_2a0,0x2a);
  md::Code::movew((Code *)local_a0,0x1d00,&local_290.super_Param);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"player_not_on_entity",&local_2c1);
  md::Code::label((Code *)local_a0,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  md::DataRegister::DataRegister(&local_300,'\0');
  local_2f0 = &local_300;
  local_2e8 = 1;
  std::allocator<md::DataRegister>::allocator(&local_301);
  __l_00._M_len = local_2e8;
  __l_00._M_array = local_2f0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_2e0,__l_00,&local_301);
  md::AddressRegister::AddressRegister((AddressRegister *)&update_func_addr,'\0');
  md::AddressRegister::AddressRegister(&local_340,'\x01');
  local_330 = (iterator)&update_func_addr;
  local_328 = 2;
  std::allocator<md::AddressRegister>::allocator(&local_351);
  __l._M_len = local_328;
  __l._M_array = local_330;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_320,__l,&local_351);
  md::Code::movem_from_stack((Code *)local_a0,&local_2e0,&local_320);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_320);
  std::allocator<md::AddressRegister>::~allocator(&local_351);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_2e0);
  std::allocator<md::DataRegister>::~allocator(&local_301);
  md::Code::rts((Code *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"",&local_379);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_a0,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  local_358 = uVar1;
  this_00 = World::map(world,0x142);
  Map::map_update_addr(this_00,local_358);
  md::Code::~Code((Code *)local_a0);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        constexpr uint32_t ADDR_NO_BEHAVIOR = 0x0009B458;
        constexpr uint32_t ADDR_BEHAVIOR_FALL = 0x0009B652;

        md::Code func;
        func.movem_to_stack({ reg_D0 }, { reg_A0, reg_A1 });
        {
            func.movew(addr_(0xFF5430), reg_D0);    // D0 = entity underneath player
            func.bmi("player_not_on_entity");
            func.cmpiw(0x500, reg_D0);
            func.bgt("player_not_on_entity");
            {
                // Player is on a platform
                func.lea(0xFF5400, reg_A1);
                func.adda(reg_D0, reg_A1);
                func.cmpil(ADDR_NO_BEHAVIOR, addr_(reg_A1, 0x32));
                func.bne("player_not_on_entity");
                // Player is on a platform that can actually fall, trigger the usual behavior
                func.movel(ADDR_BEHAVIOR_FALL, addr_(reg_A1, 0x32));
                func.movew(0x1D00, addr_(reg_A1, 0x2A));
            }
            func.label("player_not_on_entity");

        }
        func.movem_from_stack({ reg_D0 }, { reg_A0, reg_A1 });
        func.rts();

        uint32_t update_func_addr = rom.inject_code(func);
        world.map(MAP_LAKE_SHRINE_322)->map_update_addr(update_func_addr);
    }